

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_BufPrintOne(Buf_Man_t *p,int iPivot)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFan;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  
  if (-1 < iPivot) {
    pVVar2 = p->pNtk->vObjs;
    if (iPivot < pVVar2->nSize) {
      pObj = (Abc_Obj_t *)pVVar2->pArray[(uint)iPivot];
      pVVar5 = Abc_BufSortByDelay(p,iPivot);
      printf("Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {",(ulong)(uint)iPivot,
             (ulong)(uint)(pObj->vFanins).nSize,(ulong)(uint)(pObj->vFanouts).nSize,
             (ulong)(*(uint *)&pObj->field_0x14 >> 0xc));
      iVar3 = pVVar5->nSize;
      if (0 < iVar3) {
        lVar6 = 0;
        do {
          iVar1 = pVVar5->pArray[lVar6];
          if (((long)iVar1 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar1))
          goto LAB_00456f7b;
          pFan = (Abc_Obj_t *)pVVar2->pArray[iVar1];
          if (pFan != (Abc_Obj_t *)0x0) {
            uVar4 = Abc_BufEdgeSlack(p,pObj,pFan);
            printf(" %d(%d)",(ulong)(uint)pFan->Id,(ulong)uVar4);
            iVar3 = pVVar5->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar3);
      }
      puts(" }");
      return;
    }
  }
LAB_00456f7b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_BufPrintOne( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    Vec_Int_t * vOrder;
    int i, Slack;
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    vOrder = Abc_BufSortByDelay( p, iPivot );
    printf( "Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {", iPivot, Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), Abc_ObjLevel(pObj) );
    Abc_NtkForEachObjVec( vOrder, p->pNtk, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack( p, pObj, pFanout );
        printf( " %d(%d)", Abc_ObjId(pFanout), Slack );
    }
    printf( " }\n" );
}